

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializePromiseConstructor
               (DynamicObject *promiseConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar3;
  PropertyString *pPVar1;
  JavascriptFunction *pJVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,promiseConstructor,mode,9,0);
  this = (((promiseConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0xd1,&DAT_1000000000001,2,0,0,uVar4);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x124,(this->super_JavascriptLibraryBase).promisePrototype.ptr,0,0,0
             ,uVar4);
  AddSpeciesAccessorsToLibraryObject
            (this,promiseConstructor,
             (FunctionInfo *)JavascriptPromise::EntryInfo::GetterSymbolSpecies);
  pPVar1 = ScriptContext::GetPropertyString(this_00,0x43);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x106,pPVar1,2,0,0,uVar4);
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x4b,(FunctionInfo *)JavascriptPromise::EntryInfo::All,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x4c,(FunctionInfo *)JavascriptPromise::EntryInfo::AllSettled,1
             ,'\x06');
  if (((this_00->config).threadConfig)->m_ESPromiseAny == true) {
    AddFunctionToLibraryObject
              (this,promiseConstructor,0x1f,(FunctionInfo *)JavascriptPromise::EntryInfo::Any,1,
               '\x06');
  }
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x128,(FunctionInfo *)JavascriptPromise::EntryInfo::Race,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x131,(FunctionInfo *)JavascriptPromise::EntryInfo::Reject,1,
             '\x06');
  pJVar2 = EnsurePromiseResolveFunction(this);
  (*(promiseConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (promiseConstructor,0x134,pJVar2,6,0,0,uVar4 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(promiseConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializePromiseConstructor(DynamicObject* promiseConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(promiseConstructor, mode, 9);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterPromise
        // so that the update is in sync with profiler
        JavascriptLibrary* library = promiseConstructor->GetLibrary();
        ScriptContext* scriptContext = promiseConstructor->GetScriptContext();
        library->AddMember(promiseConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(promiseConstructor, PropertyIds::prototype, library->promisePrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(promiseConstructor, &JavascriptPromise::EntryInfo::GetterSymbolSpecies);
        library->AddMember(promiseConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Promise), PropertyConfigurable);

        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::all, &JavascriptPromise::EntryInfo::All, 1);
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::allSettled, &JavascriptPromise::EntryInfo::AllSettled, 1);
        if (scriptContext->GetConfig()->IsESPromiseAnyEnabled())
        {
            library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::any, &JavascriptPromise::EntryInfo::Any, 1);
        }
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::race, &JavascriptPromise::EntryInfo::Race, 1);
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::reject, &JavascriptPromise::EntryInfo::Reject, 1);
        library->AddMember(promiseConstructor, PropertyIds::resolve, library->EnsurePromiseResolveFunction(), PropertyBuiltInMethodDefaults);

        promiseConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }